

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

void test_read_bits(uchar *buf,uchar **p,size_t *bit_offset,size_t *bits_available,
                   size_t bits_wanted)

{
  ostream *poVar1;
  void *this;
  unsigned_long_long local_40;
  unsigned_long local_38;
  unsigned_long result;
  size_t bits_wanted_local;
  size_t *bits_available_local;
  size_t *bit_offset_local;
  uchar **p_local;
  uchar *buf_local;
  
  result = bits_wanted;
  bits_wanted_local = (size_t)bits_available;
  bits_available_local = bit_offset;
  bit_offset_local = (size_t *)p;
  p_local = (uchar **)buf;
  local_40 = read_bits(p,bit_offset,bits_available,bits_wanted);
  local_38 = QIntC::to_ulong<unsigned_long_long>(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"bits read: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,result);
  poVar1 = std::operator<<(poVar1,", result = ");
  this = (void *)std::ostream::operator<<(poVar1,local_38);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  print_values(*bit_offset_local - (long)p_local,*bits_available_local,*(size_t *)bits_wanted_local)
  ;
  return;
}

Assistant:

static void
test_read_bits(
    unsigned char const* buf,
    unsigned char const*& p,
    size_t& bit_offset,
    size_t& bits_available,
    size_t bits_wanted)
{
    unsigned long result = QIntC::to_ulong(read_bits(p, bit_offset, bits_available, bits_wanted));

    std::cout << "bits read: " << bits_wanted << ", result = " << result << std::endl;
    print_values(p - buf, bit_offset, bits_available);
}